

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

qpdf_offset_t __thiscall
QPDFWriter::writeXRefStream
          (QPDFWriter *this,int xref_id,int max_id,qpdf_offset_t max_offset,trailer_e which,
          int first,int last,int size,qpdf_offset_t prev,int hint_id,qpdf_offset_t hint_offset,
          qpdf_offset_t hint_length,bool skip_compression,int linearization_pass)

{
  string *psVar1;
  size_type sVar2;
  bool bVar3;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> __ptr;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> _Var4;
  char cVar5;
  int iVar6;
  size_type *psVar7;
  NewObject *pNVar8;
  undefined8 extraout_RAX;
  qpdf_offset_t qVar9;
  long *plVar10;
  element_type *peVar11;
  undefined8 *puVar12;
  logic_error *this_00;
  uint uVar13;
  uint uVar14;
  uint *args_1;
  void *pvVar15;
  QPDFWriter *pQVar16;
  Link *pLVar17;
  long *plVar18;
  size_t __n;
  ulong uVar19;
  uint uVar20;
  char cVar21;
  uint uVar22;
  uint *idx;
  unsigned_long i;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> uVar23;
  Link *pLVar24;
  type ii;
  int iVar25;
  long lVar26;
  type ii_1;
  uint uVar27;
  long lVar28;
  unsigned_long_long val;
  string __str_1;
  string __str_3;
  uint esize;
  string __str_2;
  string xref_data;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_160;
  long local_158;
  Link local_150;
  PipelinePopper local_140;
  QPDFWriter local_130;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_120;
  long local_118;
  Link local_110;
  Link **local_100;
  uint local_f8;
  undefined4 uStack_f4;
  Link *local_f0 [2];
  ulong local_e0;
  undefined4 local_d8;
  uint local_d4;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  ulong local_b0;
  long *local_a8;
  uint local_a0;
  long local_98 [2];
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_88;
  trailer_e local_80;
  int local_7c;
  ulong local_78;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_70;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type local_40;
  ulong local_38;
  
  peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar1 = peVar11->pipeline->str;
  psVar7 = (size_type *)&peVar11->pipeline->count;
  if (psVar1 != (string *)0x0) {
    psVar7 = &psVar1->_M_string_length;
  }
  uVar20 = 0;
  uVar22 = 0;
  if (max_offset + hint_length != 0) {
    uVar22 = 0;
    uVar19 = max_offset + hint_length;
    do {
      uVar22 = uVar22 + 1;
      bVar3 = 0xff < uVar19;
      uVar19 = (long)uVar19 >> 8;
    } while (bVar3);
  }
  if (max_id != 0) {
    uVar20 = 0;
    do {
      uVar20 = uVar20 + 1;
      bVar3 = 0xff < (uint)max_id;
      max_id = max_id >> 8;
    } while (bVar3);
  }
  if (uVar20 < uVar22) {
    uVar20 = uVar22;
  }
  local_40 = *psVar7;
  i = peVar11->max_ostream_index;
  if ((long)i < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
    i = peVar11->max_ostream_index;
  }
  local_e0 = 0;
  if (i != 0) {
    do {
      local_e0 = (ulong)((int)local_e0 + 1);
      bVar3 = 0xff < i;
      i = (long)i >> 8;
    } while (bVar3);
  }
  local_d4 = (int)local_e0 + uVar20 + 1;
  peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar26 = *(long *)&(peVar11->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                     super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                     super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                     ._M_impl;
  psVar1 = peVar11->pipeline->str;
  psVar7 = (size_type *)&peVar11->pipeline->count;
  if (psVar1 != (string *)0x0) {
    psVar7 = &psVar1->_M_string_length;
  }
  sVar2 = *psVar7;
  idx = (uint *)(long)xref_id;
  args_1 = (uint *)((long)*(pointer *)
                           ((long)&(peVar11->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                   super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   .
                                   super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                           + 8) - lVar26 >> 5);
  if (idx < args_1) {
    pNVar8 = (NewObject *)(lVar26 + (long)idx * 0x20);
  }
  else {
    pNVar8 = ObjTable<QPDFWriter::NewObject>::large_element
                       (&(peVar11->new_obj).super_ObjTable<QPDFWriter::NewObject>,(size_t)idx);
    peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (pNVar8->xref).type = 1;
  (pNVar8->xref).field1 = sVar2;
  (pNVar8->xref).field2 = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_140.qw = this;
  local_80 = which;
  local_7c = xref_id;
  if ((peVar11->compress_streams == false) || (local_140.stack_id = 0, peVar11->qdf_mode != false))
  {
    local_140.stack_id = 0;
    activatePipelineStack(this,&local_140,&local_60);
    local_d8 = 0;
  }
  else {
    (peVar11->count_buffer)._M_string_length = 0;
    *(peVar11->count_buffer)._M_dataplus._M_p = '\0';
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>((pl *)&local_160,&local_60);
    if (!skip_compression) {
      local_68._M_head_impl = local_160._M_head_impl;
      local_160._M_head_impl = (Link *)0x0;
      local_d0 = (long *)CONCAT44(local_d0._4_4_,1);
      ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
                ((pl *)&local_120,
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_68,
                 (action_e *)&local_d0);
      _Var4._M_head_impl = local_120._M_head_impl;
      __ptr._M_head_impl = local_160._M_head_impl;
      local_120._M_head_impl = (Link *)0x0;
      local_160._M_head_impl = _Var4._M_head_impl;
      if (__ptr._M_head_impl != (Link *)0x0) {
        std::default_delete<qpdf::pl::Link>::operator()
                  ((default_delete<qpdf::pl::Link> *)&local_160,__ptr._M_head_impl);
      }
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_120);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_68);
    }
    local_70._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
         (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)local_160._M_head_impl;
    local_160._M_head_impl = (Link *)0x0;
    local_120._M_head_impl = local_120._M_head_impl & 0xffffffff00000000;
    args_1 = &local_d4;
    ::qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
              ((pl *)&local_88,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_70,
               (action_e *)&local_120,args_1);
    activatePipelineStack(this,&local_140,&local_88);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_88);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_70);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_160);
    local_d8 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  local_78 = (ulong)(uint)(last - first);
  local_b0 = (ulong)(uint)first;
  if (first <= last) {
    uVar19 = (ulong)first;
    local_38 = (ulong)hint_id;
    lVar26 = uVar19 << 5;
    iVar25 = (last - first) + 1;
    do {
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      lVar28 = *(long *)&(peVar11->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                         super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                         .
                         super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                         ._M_impl;
      if (uVar19 < (ulong)((long)*(pointer *)
                                  ((long)&(peVar11->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                          super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                          .
                                          super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                  + 8) - lVar28 >> 5)) {
        pNVar8 = (NewObject *)(lVar28 + lVar26);
      }
      else {
        pNVar8 = ObjTable<QPDFWriter::NewObject>::large_element
                           (&(peVar11->new_obj).super_ObjTable<QPDFWriter::NewObject>,uVar19);
      }
      iVar6 = QPDFXRefEntry::getType(&pNVar8->xref);
      if (iVar6 == 0) {
        writeBinary(this,0,1);
        writeBinary(this,0,uVar20);
        writeBinary(this,0,(uint)local_e0);
      }
      else if (iVar6 == 1) {
        qVar9 = QPDFXRefEntry::getOffset(&pNVar8->xref);
        lVar28 = 0;
        if (hint_offset <= qVar9) {
          lVar28 = hint_length;
        }
        args_1 = (uint *)0x0;
        if (local_38 == uVar19) {
          lVar28 = 0;
        }
        if ((int)local_38 == 0) {
          lVar28 = 0;
        }
        writeBinary(this,1,1);
        val = lVar28 + qVar9;
        if ((long)val < 0) {
          QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
        }
        writeBinary(this,val,uVar20);
        writeBinary(this,0,(uint)local_e0);
      }
      else {
        if (iVar6 != 2) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"invalid type writing xref stream");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        writeBinary(this,2,1);
        iVar6 = QPDFXRefEntry::getObjStreamNumber(&pNVar8->xref);
        if (iVar6 < 0) {
          QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar6);
        }
        writeBinary(this,(long)iVar6,uVar20);
        iVar6 = QPDFXRefEntry::getObjStreamIndex(&pNVar8->xref);
        if (iVar6 < 0) {
          QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar6);
        }
        writeBinary(this,(long)iVar6,(uint)local_e0);
      }
      uVar19 = uVar19 + 1;
      lVar26 = lVar26 + 0x20;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
  }
  PipelinePopper::~PipelinePopper(&local_140);
  iVar25 = local_7c;
  openObject(this,local_7c);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27a944,(void *)0x2,(size_t)args_1);
  peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar11->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar11->pipeline,0x27aba5,(void *)0x2,(size_t)args_1);
    peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  ::qpdf::pl::Count::write(peVar11->pipeline,0x27ad70,(void *)0xc,(size_t)args_1);
  peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar11->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar11->pipeline,0x27aba5,(void *)0x2,(size_t)args_1);
  }
  sVar2 = local_60._M_string_length;
  cVar21 = '\x01';
  if ((void *)0x9 < local_60._M_string_length) {
    pvVar15 = (void *)local_60._M_string_length;
    cVar5 = '\x04';
    do {
      cVar21 = cVar5;
      if (pvVar15 < (void *)0x64) {
        cVar21 = cVar21 + -2;
        goto LAB_001f3b63;
      }
      if (pvVar15 < (void *)0x3e8) {
        cVar21 = cVar21 + -1;
        goto LAB_001f3b63;
      }
      if (pvVar15 < (void *)0x2710) goto LAB_001f3b63;
      bVar3 = (void *)0x1869f < pvVar15;
      pvVar15 = (void *)((ulong)pvVar15 / 10000);
      cVar5 = cVar21 + '\x04';
    } while (bVar3);
    cVar21 = cVar21 + '\x01';
  }
LAB_001f3b63:
  local_160._M_head_impl = &local_150;
  std::__cxx11::string::_M_construct((ulong)&local_160,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_160._M_head_impl,(uint)local_158,sVar2);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,0x27a5a8);
  pQVar16 = (QPDFWriter *)(plVar10 + 2);
  if ((QPDFWriter *)*plVar10 == pQVar16) {
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[3];
    local_140.qw = &local_130;
  }
  else {
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_140.qw = (QPDFWriter *)*plVar10;
  }
  local_140.stack_id = plVar10[1];
  *plVar10 = (long)pQVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_140.qw,(void *)local_140.stack_id,(size_t)pQVar16);
  if (local_140.qw != &local_130) {
    operator_delete(local_140.qw,
                    (ulong)((long)&(local_130.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  if (local_160._M_head_impl != &local_150) {
    operator_delete(local_160._M_head_impl,
                    (ulong)((long)local_150.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if ((char)local_d8 != '\0') {
    peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar11->qdf_mode == true) {
      ::qpdf::pl::Count::write(peVar11->pipeline,0x27aba5,(void *)0x2,(size_t)pQVar16);
      peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
    }
    ::qpdf::pl::Count::write(peVar11->pipeline,0x27abb7,(void *)0x15,(size_t)pQVar16);
    peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar11->qdf_mode == true) {
      ::qpdf::pl::Count::write(peVar11->pipeline,0x27aba5,(void *)0x2,(size_t)pQVar16);
    }
    uVar22 = local_d4;
    cVar21 = '\x01';
    if (9 < local_d4) {
      uVar27 = local_d4;
      cVar5 = '\x04';
      do {
        cVar21 = cVar5;
        if (uVar27 < 100) {
          cVar21 = cVar21 + -2;
          goto LAB_001f3cf7;
        }
        if (uVar27 < 1000) {
          cVar21 = cVar21 + -1;
          goto LAB_001f3cf7;
        }
        if (uVar27 < 10000) goto LAB_001f3cf7;
        bVar3 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar5 = cVar21 + '\x04';
      } while (bVar3);
      cVar21 = cVar21 + '\x01';
    }
LAB_001f3cf7:
    local_120._M_head_impl = &local_110;
    std::__cxx11::string::_M_construct((ulong)&local_120,cVar21);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_120._M_head_impl,(uint)local_118,uVar22);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x27ad7d);
    pLVar17 = (Link *)(plVar10 + 2);
    if ((Link *)*plVar10 == pLVar17) {
      local_150.next_link._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
            &(pLVar17->next_link)._M_t.
             super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
             super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
      local_150.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
      super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
      super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
           (__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true>)
           ((_Head_base<0UL,_Pipeline_*,_false> *)(plVar10 + 3))->_M_head_impl;
      local_160._M_head_impl = &local_150;
    }
    else {
      local_150.next_link._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
            &(pLVar17->next_link)._M_t.
             super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
             super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
      local_160._M_head_impl = (Link *)*plVar10;
    }
    local_158 = plVar10[1];
    *plVar10 = (long)pLVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    pQVar16 = (QPDFWriter *)(puVar12 + 2);
    if ((QPDFWriter *)*puVar12 == pQVar16) {
      local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[3];
      local_140.qw = &local_130;
    }
    else {
      local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_140.qw = (QPDFWriter *)*puVar12;
    }
    local_140.stack_id = puVar12[1];
    *puVar12 = pQVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_140.qw,(void *)local_140.stack_id,(size_t)pQVar16);
    if (local_140.qw != &local_130) {
      operator_delete(local_140.qw,
                      (ulong)((long)&(local_130.m.
                                      super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->pdf + 1));
    }
    if (local_160._M_head_impl != &local_150) {
      operator_delete(local_160._M_head_impl,
                      (ulong)((long)local_150.next_link._M_t.
                                    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                    .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1
                             ));
    }
    if (local_120._M_head_impl != &local_110) {
      operator_delete(local_120._M_head_impl,
                      (ulong)((long)local_110.next_link._M_t.
                                    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                    .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1
                             ));
    }
  }
  peVar11 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar11->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar11->pipeline,0x27aba5,(void *)0x2,(size_t)pQVar16);
  }
  cVar21 = '\x01';
  if (9 < uVar20) {
    uVar19 = (ulong)uVar20;
    cVar5 = '\x04';
    do {
      cVar21 = cVar5;
      uVar22 = (uint)uVar19;
      if (uVar22 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_001f3eaa;
      }
      if (uVar22 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_001f3eaa;
      }
      if (uVar22 < 10000) goto LAB_001f3eaa;
      uVar19 = uVar19 / 10000;
      cVar5 = cVar21 + '\x04';
    } while (99999 < uVar22);
    cVar21 = cVar21 + '\x01';
  }
LAB_001f3eaa:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a8,local_a0,uVar20);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x27adaa);
  local_d0 = &local_c0;
  plVar18 = plVar10 + 2;
  if ((long *)*plVar10 == plVar18) {
    local_c0 = *plVar18;
    lStack_b8 = plVar10[3];
  }
  else {
    local_c0 = *plVar18;
    local_d0 = (long *)*plVar10;
  }
  local_c8 = plVar10[1];
  *plVar10 = (long)plVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_d0);
  pLVar17 = (Link *)(plVar10 + 2);
  if ((Link *)*plVar10 == pLVar17) {
    local_110.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_110.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         (__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true>)plVar10[3];
    local_120._M_head_impl = &local_110;
  }
  else {
    local_110.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_120._M_head_impl = (Link *)*plVar10;
  }
  local_118 = plVar10[1];
  *plVar10 = (long)pLVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  cVar21 = '\x01';
  if (9 < (uint)local_e0) {
    uVar19 = local_e0;
    cVar5 = '\x04';
    do {
      cVar21 = cVar5;
      uVar20 = (uint)uVar19;
      if (uVar20 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_001f3ff8;
      }
      if (uVar20 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_001f3ff8;
      }
      if (uVar20 < 10000) goto LAB_001f3ff8;
      uVar19 = (uVar19 & 0xffffffff) / 10000;
      cVar5 = cVar21 + '\x04';
    } while (99999 < uVar20);
    cVar21 = cVar21 + '\x01';
  }
LAB_001f3ff8:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_100,local_f8,(uint)local_e0);
  pLVar17 = (Link *)(local_118 + CONCAT44(uStack_f4,local_f8));
  uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)(Link *)0xf
  ;
  if (local_120._M_head_impl != &local_110) {
    uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         local_110.next_link._M_t.
         super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
         super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  }
  if ((ulong)uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
             ._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl < pLVar17) {
    pLVar24 = (Link *)0xf;
    if (local_100 != local_f0) {
      pLVar24 = local_f0[0];
    }
    if (pLVar24 < pLVar17) goto LAB_001f406a;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_100,0,(char *)0x0,(ulong)local_120._M_head_impl);
  }
  else {
LAB_001f406a:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100);
  }
  pLVar17 = (Link *)(plVar10 + 2);
  if ((Link *)*plVar10 == pLVar17) {
    local_150.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_150.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         *(__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true> *)
          &((_Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_> *)(plVar10 + 3))->
           super__Head_base<0UL,_Pipeline_*,_false>;
    local_160._M_head_impl = &local_150;
  }
  else {
    local_150.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_160._M_head_impl = (Link *)*plVar10;
  }
  local_158 = plVar10[1];
  *plVar10 = (long)pLVar17;
  plVar10[1] = 0;
  *(undefined1 *)
   &(pLVar17->next_link)._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false> = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
  pQVar16 = (QPDFWriter *)(plVar10 + 2);
  if ((QPDFWriter *)*plVar10 == pQVar16) {
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[3];
    local_140.qw = &local_130;
  }
  else {
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_140.qw = (QPDFWriter *)*plVar10;
  }
  local_140.stack_id = plVar10[1];
  *plVar10 = (long)pQVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_140.qw,(void *)local_140.stack_id,(size_t)pQVar16);
  if (local_140.qw != &local_130) {
    operator_delete(local_140.qw,
                    (ulong)((long)&(local_130.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  if (local_160._M_head_impl != &local_150) {
    operator_delete(local_160._M_head_impl,
                    (ulong)((long)local_150.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,
                    (ulong)((long)&(local_f0[0]->next_link)._M_t.
                                   super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                   .super__Head_base<0UL,_qpdf::pl::Link_*,_false> + 1));
  }
  if (local_120._M_head_impl != &local_110) {
    operator_delete(local_120._M_head_impl,
                    (ulong)((long)local_110.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  uVar20 = (uint)local_b0;
  if (size + -1 == last && uVar20 == 0) goto LAB_001f45c5;
  uVar22 = -uVar20;
  if (0 < (int)uVar20) {
    uVar22 = uVar20;
  }
  uVar20 = 1;
  if (9 < uVar22) {
    uVar19 = (ulong)uVar22;
    uVar27 = 4;
    do {
      uVar20 = uVar27;
      uVar13 = (uint)uVar19;
      if (uVar13 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_001f4255;
      }
      if (uVar13 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_001f4255;
      }
      if (uVar13 < 10000) goto LAB_001f4255;
      uVar19 = uVar19 / 10000;
      uVar27 = uVar20 + 4;
    } while (99999 < uVar13);
    uVar20 = uVar20 + 1;
  }
LAB_001f4255:
  uVar19 = local_b0 >> 0x1f;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct
            ((ulong)&local_a8,(char)uVar20 - ((char)(local_b0 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_a8 + (uVar19 & 1)),uVar20,uVar22);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x27adb3);
  uVar19 = local_78;
  local_d0 = &local_c0;
  plVar18 = plVar10 + 2;
  if ((long *)*plVar10 == plVar18) {
    local_c0 = *plVar18;
    lStack_b8 = plVar10[3];
  }
  else {
    local_c0 = *plVar18;
    local_d0 = (long *)*plVar10;
  }
  local_c8 = plVar10[1];
  *plVar10 = (long)plVar18;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_d0);
  pLVar17 = (Link *)(plVar10 + 2);
  if ((Link *)*plVar10 == pLVar17) {
    local_110.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_110.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         (__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true>)plVar10[3];
    local_120._M_head_impl = &local_110;
  }
  else {
    local_110.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_120._M_head_impl = (Link *)*plVar10;
  }
  local_118 = plVar10[1];
  *plVar10 = (long)pLVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar22 = (int)uVar19 + 1;
  uVar20 = -uVar22;
  if (0 < (int)uVar22) {
    uVar20 = uVar22;
  }
  uVar27 = 1;
  if (9 < uVar20) {
    uVar19 = (ulong)uVar20;
    uVar13 = 4;
    do {
      uVar27 = uVar13;
      uVar14 = (uint)uVar19;
      if (uVar14 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_001f43c6;
      }
      if (uVar14 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_001f43c6;
      }
      if (uVar14 < 10000) goto LAB_001f43c6;
      uVar19 = uVar19 / 10000;
      uVar13 = uVar27 + 4;
    } while (99999 < uVar14);
    uVar27 = uVar27 + 1;
  }
LAB_001f43c6:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,(char)uVar27 - (char)((int)uVar22 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_100 + (ulong)(uVar22 >> 0x1f)),uVar27,uVar20);
  pLVar17 = (Link *)(local_118 + CONCAT44(uStack_f4,local_f8));
  uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)(Link *)0xf
  ;
  if (local_120._M_head_impl != &local_110) {
    uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         local_110.next_link._M_t.
         super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
         super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  }
  if ((ulong)uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
             ._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl < pLVar17) {
    pLVar24 = (Link *)0xf;
    if (local_100 != local_f0) {
      pLVar24 = local_f0[0];
    }
    if (pLVar24 < pLVar17) goto LAB_001f4450;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_100,0,(char *)0x0,(ulong)local_120._M_head_impl);
  }
  else {
LAB_001f4450:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100);
  }
  local_160._M_head_impl = &local_150;
  pLVar17 = (Link *)(plVar10 + 2);
  if ((Link *)*plVar10 == pLVar17) {
    local_150.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_150.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         *(__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true> *)
          &((_Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_> *)(plVar10 + 3))->
           super__Head_base<0UL,_Pipeline_*,_false>;
  }
  else {
    local_150.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_160._M_head_impl = (Link *)*plVar10;
  }
  local_158 = plVar10[1];
  *plVar10 = (long)pLVar17;
  plVar10[1] = 0;
  *(undefined1 *)
   &(pLVar17->next_link)._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false> = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
  pQVar16 = (QPDFWriter *)(plVar10 + 2);
  if ((QPDFWriter *)*plVar10 == pQVar16) {
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[3];
    local_140.qw = &local_130;
  }
  else {
    local_130.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_140.qw = (QPDFWriter *)*plVar10;
  }
  local_140.stack_id = plVar10[1];
  *plVar10 = (long)pQVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_140.qw,(void *)local_140.stack_id,(size_t)pQVar16);
  if (local_140.qw != &local_130) {
    operator_delete(local_140.qw,
                    (ulong)((long)&(local_130.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  if (local_160._M_head_impl != &local_150) {
    operator_delete(local_160._M_head_impl,
                    (ulong)((long)local_150.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,
                    (ulong)((long)&(local_f0[0]->next_link)._M_t.
                                   super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                   .super__Head_base<0UL,_qpdf::pl::Link_*,_false> + 1));
  }
  if (local_120._M_head_impl != &local_110) {
    operator_delete(local_120._M_head_impl,
                    (ulong)((long)local_110.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
LAB_001f45c5:
  __n = 1;
  writeTrailer(this,local_80,size,true,prev,linearization_pass);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27ad26,(void *)0x8,__n);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_60._M_dataplus._M_p,(void *)local_60._M_string_length,__n);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27adbe,(void *)0xa,__n);
  closeObject(this,iVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return local_40 - 1;
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefStream(
    int xref_id,
    int max_id,
    qpdf_offset_t max_offset,
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    bool skip_compression,
    int linearization_pass)
{
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    qpdf_offset_t space_before_zero = xref_offset - 1;

    // field 1 contains offsets and object stream identifiers
    unsigned int f1_size = std::max(bytesNeeded(max_offset + hint_length), bytesNeeded(max_id));

    // field 2 contains object stream indices
    unsigned int f2_size = bytesNeeded(QIntC::to_longlong(m->max_ostream_index));

    unsigned int esize = 1 + f1_size + f2_size;

    // Must store in xref table in advance of writing the actual data rather than waiting for
    // openObject to do it.
    m->new_obj[xref_id].xref = QPDFXRefEntry(m->pipeline->getCount());

    std::string xref_data;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        PipelinePopper pp_xref(this);
        if (compressed) {
            m->count_buffer.clear();
            auto link = pl::create<pl::String>(xref_data);
            if (!skip_compression) {
                // Write the stream dictionary for compression but don't actually compress.  This
                // helps us with computation of padding for pass 1 of linearization.
                link = pl::create<Pl_Flate>(std::move(link), Pl_Flate::a_deflate);
            }
            activatePipelineStack(
                pp_xref, pl::create<Pl_PNGFilter>(std::move(link), Pl_PNGFilter::a_encode, esize));
        } else {
            activatePipelineStack(pp_xref, xref_data);
        }

        for (int i = first; i <= last; ++i) {
            QPDFXRefEntry& e = m->new_obj[i].xref;
            switch (e.getType()) {
            case 0:
                writeBinary(0, 1);
                writeBinary(0, f1_size);
                writeBinary(0, f2_size);
                break;

            case 1:
                {
                    qpdf_offset_t offset = e.getOffset();
                    if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                        offset += hint_length;
                    }
                    writeBinary(1, 1);
                    writeBinary(QIntC::to_ulonglong(offset), f1_size);
                    writeBinary(0, f2_size);
                }
                break;

            case 2:
                writeBinary(2, 1);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamNumber()), f1_size);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamIndex()), f2_size);
                break;

            default:
                throw std::logic_error("invalid type writing xref stream");
                break;
            }
        }
    }

    openObject(xref_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /XRef");
    writeStringQDF("\n ");
    writeString(" /Length " + std::to_string(xref_data.size()));
    if (compressed) {
        writeStringQDF("\n ");
        writeString(" /Filter /FlateDecode");
        writeStringQDF("\n ");
        writeString(" /DecodeParms << /Columns " + std::to_string(esize) + " /Predictor 12 >>");
    }
    writeStringQDF("\n ");
    writeString(" /W [ 1 " + std::to_string(f1_size) + " " + std::to_string(f2_size) + " ]");
    if (!((first == 0) && (last == size - 1))) {
        writeString(
            " /Index [ " + std::to_string(first) + " " + std::to_string(last - first + 1) + " ]");
    }
    writeTrailer(which, size, true, prev, linearization_pass);
    writeString("\nstream\n");
    writeString(xref_data);
    writeString("\nendstream");
    closeObject(xref_id);
    return space_before_zero;
}